

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O2

Instruction * __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::CreateAccessChainWithIndex
          (InterfaceVariableScalarReplacement *this,uint32_t component_type_id,Instruction *var,
          uint32_t index,Instruction *insert_before)

{
  IRContext *c;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> inst;
  StorageClass storage_class;
  uint32_t ty_id;
  uint32_t uVar1;
  uint32_t res_id;
  ConstantManager *this_00;
  Instruction *this_01;
  DefUseManager *this_02;
  long lVar2;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_108;
  uint32_t local_100;
  uint32_t local_fc;
  undefined1 local_f8 [48];
  undefined4 local_c8;
  SmallVector<unsigned_int,_2UL> local_c0;
  SmallVector<unsigned_int,_2UL> local_98;
  SmallVector<unsigned_int,_2UL> local_70;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  storage_class = anon_unknown_0::GetStorageClass(var);
  ty_id = GetPointerType(this,component_type_id,storage_class);
  this_00 = IRContext::get_constant_mgr((this->super_Pass).context_);
  uVar1 = analysis::ConstantManager::GetUIntConstId(this_00,index);
  this_01 = (Instruction *)::operator_new(0x70);
  c = (this->super_Pass).context_;
  res_id = Pass::TakeNextId(&this->super_Pass);
  local_fc = Instruction::result_id(var);
  init_list._M_len = 1;
  init_list._M_array = &local_fc;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_70,init_list);
  local_f8._0_4_ = 1;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_f8 + 8),&local_70);
  init_list_00._M_len = 1;
  init_list_00._M_array = &local_100;
  local_100 = uVar1;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_98,init_list_00);
  local_c8 = 1;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_c0,&local_98);
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  _M_range_initialize<spvtools::opt::Operand_const*>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_48,
             local_f8,&local_98);
  Instruction::Instruction(this_01,c,OpAccessChain,ty_id,res_id,(OperandList *)&local_48);
  local_108._M_head_impl = this_01;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_48);
  lVar2 = 0x38;
  do {
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector
              ((SmallVector<unsigned_int,_2UL> *)(local_f8 + lVar2));
    lVar2 = lVar2 + -0x30;
  } while (lVar2 != -0x28);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_98);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_70);
  inst._M_head_impl = local_108._M_head_impl;
  this_02 = IRContext::get_def_use_mgr((this->super_Pass).context_);
  analysis::DefUseManager::AnalyzeInstDefUse(this_02,inst._M_head_impl);
  Instruction::InsertBefore
            (insert_before,
             (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              *)&local_108);
  if (local_108._M_head_impl != (Instruction *)0x0) {
    (*((local_108._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
      _vptr_IntrusiveNodeBase[1])();
  }
  return inst._M_head_impl;
}

Assistant:

Instruction* InterfaceVariableScalarReplacement::CreateAccessChainWithIndex(
    uint32_t component_type_id, Instruction* var, uint32_t index,
    Instruction* insert_before) {
  uint32_t ptr_type_id =
      GetPointerType(component_type_id, GetStorageClass(var));
  uint32_t index_id = context()->get_constant_mgr()->GetUIntConstId(index);
  std::unique_ptr<Instruction> new_access_chain(new Instruction(
      context(), spv::Op::OpAccessChain, ptr_type_id, TakeNextId(),
      std::initializer_list<Operand>{
          {SPV_OPERAND_TYPE_ID, {var->result_id()}},
          {SPV_OPERAND_TYPE_ID, {index_id}},
      }));
  Instruction* inst = new_access_chain.get();
  context()->get_def_use_mgr()->AnalyzeInstDefUse(inst);
  insert_before->InsertBefore(std::move(new_access_chain));
  return inst;
}